

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O2

void __thiscall
btGeneric6DofSpring2Constraint::setEquilibriumPoint(btGeneric6DofSpring2Constraint *this)

{
  long lVar1;
  btVector3 *pbVar2;
  
  calculateTransforms(this);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    (this->m_linearLimits).m_equilibriumPoint.m_floats[lVar1] =
         (this->m_calculatedLinearDiff).m_floats[lVar1];
  }
  pbVar2 = &this->m_calculatedAxisAngleDiff;
  for (lVar1 = -0x108; lVar1 != 0; lVar1 = lVar1 + 0x58) {
    *(btScalar *)((long)(this->m_calculatedTransformB).m_basis.m_el[0].m_floats + lVar1) =
         pbVar2->m_floats[0];
    pbVar2 = (btVector3 *)(pbVar2->m_floats + 1);
  }
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::setEquilibriumPoint()
{
	calculateTransforms();
	int i;
	for( i = 0; i < 3; i++)
		m_linearLimits.m_equilibriumPoint[i] = m_calculatedLinearDiff[i];
	for(i = 0; i < 3; i++)
		m_angularLimits[i].m_equilibriumPoint = m_calculatedAxisAngleDiff[i];
}